

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_init.c
# Opt level: O2

void setgemprobs(d_level *dlev)

{
  int iVar1;
  xchar xVar2;
  xchar xVar3;
  char cVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  short *psVar9;
  long lVar10;
  
  if (dlev == (d_level *)0x0) {
    uVar6 = 9;
  }
  else {
    xVar2 = ledger_no(dlev);
    xVar3 = maxledgerno();
    if (xVar3 < xVar2) {
      cVar4 = maxledgerno();
    }
    else {
      cVar4 = ledger_no(dlev);
    }
    uVar6 = (uint)(char)(cVar4 / -3 + '\t');
  }
  iVar1 = bases[0xd];
  uVar5 = 0;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar7 = uVar5;
  }
  psVar9 = &objects[bases[0xd]].oc_prob;
  for (; -uVar5 != uVar7; uVar5 = uVar5 - 1) {
    *psVar9 = 0;
    psVar9 = psVar9 + 0x14;
  }
  uVar6 = (int)uVar7 + iVar1;
  uVar8 = ((long)-(int)uVar7 - uVar5) + 0xab;
  if ((int)uVar6 < 0x206) {
    if ((objects[(int)uVar6].oc_class == '\r') &&
       (obj_descr[objects[(int)uVar6].oc_name_idx].oc_name != (char *)0x0)) goto LAB_001fca04;
  }
  raw_printf("Not enough gems? - first=%d j=%d LAST_GEM=%d\n",(ulong)uVar6,uVar7,0x205);
LAB_001fca04:
  lVar10 = (long)(iVar1 - (int)uVar5);
  psVar9 = &objects[lVar10].oc_prob;
  for (; lVar10 < 0x206; lVar10 = lVar10 + 1) {
    *psVar9 = (short)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                     (long)(int)(0x206 - uVar6));
    uVar8 = (ulong)((int)uVar8 + 1);
    psVar9 = psVar9 + 0x14;
  }
  return;
}

Assistant:

static void setgemprobs(const d_level *dlev)
{
	int j, first, lev;

	if (dlev)
	    lev = (ledger_no(dlev) > maxledgerno())
				? maxledgerno() : ledger_no(dlev);
	else
	    lev = 0;
	first = bases[GEM_CLASS];

	for (j = 0; j < 9-lev/3; j++)
		objects[first+j].oc_prob = 0;
	first += j;
	if (first > LAST_GEM || objects[first].oc_class != GEM_CLASS ||
	    OBJ_NAME(objects[first]) == NULL) {
		raw_printf("Not enough gems? - first=%d j=%d LAST_GEM=%d\n",
			first, j, LAST_GEM);
	    }
	for (j = first; j <= LAST_GEM; j++)
		objects[j].oc_prob = (171+j-first)/(LAST_GEM+1-first);
}